

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::unroll_array_to_complex_store
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id)

{
  BaseType expr_type;
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *var;
  SPIRType *pSVar3;
  CompilerError *this_00;
  char (*ts_1) [4];
  string array_expr;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  undefined1 local_178 [32];
  uint *local_158;
  size_t local_150;
  size_t local_148;
  uint local_140 [8];
  bool *local_120;
  size_t local_118;
  size_t local_110;
  bool local_108 [8];
  uint32_t local_100;
  bool local_fc;
  bool local_fb;
  StorageClass local_f8;
  TypedID<(spirv_cross::Types)1> *local_f0;
  size_t local_e8;
  size_t local_e0;
  TypedID<(spirv_cross::Types)1> local_d8 [8];
  uint *local_b8;
  size_t local_b0;
  size_t local_a8;
  uint local_a0 [8];
  TypeID local_80;
  undefined8 local_68;
  __node_base_ptr *local_60;
  size_type local_58;
  __node_base local_50;
  size_type sStack_48;
  float local_40;
  size_t local_38;
  __node_base_ptr p_Stack_30;
  
  if (((((this->backend).force_gl_in_out_block == true) &&
       (var = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,target_id),
       var != (SPIRVariable *)0x0)) && (var->storage == StorageClassOutput)) &&
     ((bVar1 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar1 &&
      (uVar2 = Compiler::get_decoration
                         (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationBuiltIn)
      , uVar2 == 0x14)))) {
    pSVar3 = Compiler::expression_type(&this->super_Compiler,source_id);
    array_expr._M_dataplus._M_p = (pointer)&array_expr.field_2;
    array_expr._M_string_length = 0;
    array_expr.field_2._M_local_buf[0] = '\0';
    if ((pSVar3->array_size_literal).super_VectorView<bool>.ptr
        [(pSVar3->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
      convert_to_string<unsigned_int,_0>
                ((string *)local_178,
                 (pSVar3->array).super_VectorView<unsigned_int>.ptr +
                 ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size - 1));
      ::std::__cxx11::string::operator=((string *)&array_expr,(string *)local_178);
      ::std::__cxx11::string::~string((string *)local_178);
      if ((pSVar3->array).super_VectorView<unsigned_int>.ptr
          [(pSVar3->array).super_VectorView<unsigned_int>.buffer_size - 1] == 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_178,"Cannot unroll an array copy from unsized array.",
                   (allocator *)&local_1f8);
        CompilerError::CompilerError(this_00,(string *)local_178);
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      to_expression_abi_cxx11_
                ((string *)local_178,this,
                 (pSVar3->array).super_VectorView<unsigned_int>.ptr
                 [(pSVar3->array).super_VectorView<unsigned_int>.buffer_size - 1],true);
      ::std::__cxx11::string::operator=((string *)&array_expr,(string *)local_178);
      ::std::__cxx11::string::~string((string *)local_178);
    }
    local_158 = local_140;
    local_178._8_4_ = 0;
    local_178._0_8_ = &PTR__SPIRType_0043c280;
    local_178._16_4_ = 0;
    local_178._20_4_ = 1;
    local_150 = 0;
    local_148 = 8;
    local_120 = local_108;
    local_118 = 0;
    local_110 = 8;
    local_100 = 0;
    local_fc = false;
    local_fb = false;
    local_f8 = StorageClassGeneric;
    local_f0 = local_d8;
    local_e8 = 0;
    local_e0 = 8;
    local_b8 = local_a0;
    local_b0 = 0;
    local_a8 = 8;
    local_80.id = 0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_60 = &p_Stack_30;
    local_58 = 1;
    local_50._M_nxt = (_Hash_node_base *)0x0;
    sStack_48 = 0;
    local_40 = 1.0;
    local_38 = 0;
    p_Stack_30 = (__node_base_ptr)0x0;
    local_178._12_4_ = 7;
    local_178._24_4_ = local_178._20_4_;
    statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
              (this,(char (*) [25])"for (int i = 0; i < int(",&array_expr,(char (*) [8])"); i++)");
    begin_scope(this);
    to_expression_abi_cxx11_(&local_1f8,this,target_id,true);
    expr_type = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
    ts_1 = (char (*) [4])0x1;
    to_expression_abi_cxx11_(&local_1d8,this,source_id,true);
    join<std::__cxx11::string,char_const(&)[4]>
              (&local_1b8,(spirv_cross *)&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[i]",ts_1);
    bitcast_expression(&local_198,this,(SPIRType *)local_178,expr_type,&local_1b8);
    statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
              (this,&local_1f8,(char (*) [7])"[i] = ",&local_198,(char (*) [2])0x37e4df);
    ::std::__cxx11::string::~string((string *)&local_198);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    end_scope(this);
    SPIRType::~SPIRType((SPIRType *)local_178);
    ::std::__cxx11::string::~string((string *)&array_expr);
    return true;
  }
  return false;
}

Assistant:

bool CompilerGLSL::unroll_array_to_complex_store(uint32_t target_id, uint32_t source_id)
{
	if (!backend.force_gl_in_out_block)
		return false;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(target_id);
	if (!var || var->storage != StorageClassOutput)
		return false;

	if (!is_builtin_variable(*var) || BuiltIn(get_decoration(var->self, DecorationBuiltIn)) != BuiltInSampleMask)
		return false;

	auto &type = expression_type(source_id);
	string array_expr;
	if (type.array_size_literal.back())
	{
		array_expr = convert_to_string(type.array.back());
		if (type.array.back() == 0)
			SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
	}
	else
		array_expr = to_expression(type.array.back());

	SPIRType target_type;
	target_type.basetype = SPIRType::Int;

	statement("for (int i = 0; i < int(", array_expr, "); i++)");
	begin_scope();
	statement(to_expression(target_id), "[i] = ",
	          bitcast_expression(target_type, type.basetype, join(to_expression(source_id), "[i]")),
	          ";");
	end_scope();

	return true;
}